

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput.cpp
# Opt level: O1

void __thiscall
ncnn::Yolov3DetectionOutput::nms_sorted_bboxes
          (Yolov3DetectionOutput *this,
          vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
          *bboxes,vector<unsigned_long,_std::allocator<unsigned_long>_> *picked,float nms_threshold)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  pointer puVar5;
  iterator __position;
  pointer pBVar6;
  unsigned_long uVar7;
  bool bVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  bool bVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  unsigned_long local_40;
  float local_34;
  
  puVar5 = (picked->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((picked->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar5) {
    (picked->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar5;
  }
  local_40 = 0;
  lVar9 = (long)(bboxes->
                super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(bboxes->
                super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                )._M_impl.super__Vector_impl_data._M_start;
  if (lVar9 != 0) {
    local_34 = nms_threshold;
    do {
      puVar5 = (picked->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      __position._M_current =
           (picked->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      uVar10 = (uint)((ulong)((long)__position._M_current - (long)puVar5) >> 3);
      if ((int)uVar10 < 1) {
LAB_0046b101:
        if (__position._M_current ==
            (picked->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)picked,__position,
                     &local_40);
          nms_threshold = local_34;
        }
        else {
          *__position._M_current = local_40;
          (picked->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
      else {
        pBVar6 = (bboxes->
                 super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        fVar1 = pBVar6[local_40].xmin;
        bVar8 = true;
        uVar11 = 1;
        do {
          uVar7 = puVar5[uVar11 - 1];
          fVar14 = pBVar6[uVar7].xmax;
          fVar13 = 0.0;
          if (fVar1 <= fVar14) {
            fVar2 = pBVar6[local_40].xmax;
            fVar16 = pBVar6[uVar7].xmin;
            if (fVar16 <= fVar2) {
              fVar3 = pBVar6[local_40].ymin;
              fVar15 = pBVar6[uVar7].ymax;
              if (fVar3 <= fVar15) {
                fVar4 = pBVar6[local_40].ymax;
                fVar17 = pBVar6[uVar7].ymin;
                if (fVar17 <= fVar4) {
                  if (fVar2 <= fVar14) {
                    fVar14 = fVar2;
                  }
                  if (fVar16 <= fVar1) {
                    fVar16 = fVar1;
                  }
                  if (fVar4 <= fVar15) {
                    fVar15 = fVar4;
                  }
                  if (fVar17 <= fVar3) {
                    fVar17 = fVar3;
                  }
                  fVar13 = (fVar15 - fVar17) * (fVar14 - fVar16);
                }
              }
            }
          }
          if (((pBVar6[local_40].area - fVar13) + pBVar6[uVar7].area) * nms_threshold < fVar13) {
            bVar8 = false;
            break;
          }
          bVar12 = uVar11 < (uVar10 & 0x7fffffff);
          uVar11 = uVar11 + 1;
        } while (bVar12);
        if (bVar8) goto LAB_0046b101;
      }
      local_40 = local_40 + 1;
    } while (local_40 < (ulong)((lVar9 >> 2) * 0x6db6db6db6db6db7));
  }
  return;
}

Assistant:

void Yolov3DetectionOutput::nms_sorted_bboxes(std::vector<BBoxRect>& bboxes, std::vector<size_t>& picked, float nms_threshold) const
{
    picked.clear();

    const size_t n = bboxes.size();

    for (size_t i = 0; i < n; i++)
    {
        const BBoxRect& a = bboxes[i];

        int keep = 1;
        for (int j = 0; j < (int)picked.size(); j++)
        {
            const BBoxRect& b = bboxes[picked[j]];

            // intersection over union
            float inter_area = intersection_area(a, b);
            float union_area = a.area + b.area - inter_area;
            // float IoU = inter_area / union_area
            if (inter_area > nms_threshold * union_area)
            {
                keep = 0;
                break;
            }
        }

        if (keep)
            picked.push_back(i);
    }
}